

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

Encoding * __thiscall cmsys::Encoding::ToWide(Encoding *this,string *str)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  Encoding local_60 [48];
  long local_30;
  size_t nullPos;
  size_t pos;
  string *local_18;
  string *str_local;
  wstring *wstr;
  
  pos._7_1_ = 0;
  local_18 = str;
  str_local = (string *)this;
  std::__cxx11::wstring::wstring((wstring *)this);
  nullPos = 0;
  local_30 = 0;
  do {
    sVar1 = nullPos;
    uVar2 = std::__cxx11::string::size();
    if ((sVar1 < uVar2) &&
       (pcVar3 = (char *)std::__cxx11::string::at((ulong)local_18), *pcVar3 != '\0')) {
      lVar4 = std::__cxx11::string::c_str();
      ToWide_abi_cxx11_(local_60,(char *)(lVar4 + nullPos));
      std::__cxx11::wstring::operator+=((wstring *)this,(wstring *)local_60);
      std::__cxx11::wstring::~wstring((wstring *)local_60);
    }
    local_30 = std::__cxx11::string::find((char)local_18,0);
    if (local_30 != -1) {
      nullPos = local_30 + 1;
      std::__cxx11::wstring::operator+=((wstring *)this,L'\0');
    }
  } while (local_30 != -1);
  return this;
}

Assistant:

std::wstring Encoding::ToWide(const std::string& str)
{
  std::wstring wstr;
#  if defined(_WIN32)
  const int wlength =
    MultiByteToWideChar(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str.data(),
                        int(str.size()), nullptr, 0);
  if (wlength > 0) {
    wchar_t* wdata = new wchar_t[wlength];
    int r = MultiByteToWideChar(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str.data(),
                                int(str.size()), wdata, wlength);
    if (r > 0) {
      wstr = std::wstring(wdata, wlength);
    }
    delete[] wdata;
  }
#  else
  size_t pos = 0;
  size_t nullPos = 0;
  do {
    if (pos < str.size() && str.at(pos) != '\0') {
      wstr += ToWide(str.c_str() + pos);
    }
    nullPos = str.find('\0', pos);
    if (nullPos != std::string::npos) {
      pos = nullPos + 1;
      wstr += wchar_t('\0');
    }
  } while (nullPos != std::string::npos);
#  endif
  return wstr;
}